

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_1::SyncObjectResetCase::passAndLog
          (SyncObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ContextReset *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar1;
  Enum<int,_2UL> EVar2;
  Enum<int,_2UL> local_1e0;
  GetNameFunc local_1d0;
  int local_1c8;
  Enum<int,_2UL> local_1c0 [2];
  MessageBuilder local_1a0;
  GLint local_1c;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *pSStack_18;
  GLint status;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset_local;
  SyncObjectResetCase *this_local;
  
  pSStack_18 = contextReset;
  contextReset_local = (SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *)this;
  this_00 = de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::operator->(contextReset);
  local_1c = ContextReset::getSyncStatus(this_00);
  if (local_1c == 0x9119) {
    tcu::TestContext::setTestResult
              ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase
               .super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    this_01 = tcu::TestContext::getLog
                        ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_1a0,
                        (char (*) [50])"Test failed! glGetSynciv() returned wrong value [");
    EVar2 = glu::getErrorStr(local_1c);
    local_1d0 = EVar2.m_getName;
    local_1c8 = EVar2.m_value;
    local_1c0[0].m_getName = local_1d0;
    local_1c0[0].m_value = local_1c8;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_1c0);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])0x2c24a65);
    EVar2 = glu::getErrorStr(0x9119);
    local_1e0.m_getName = EVar2.m_getName;
    local_1e0.m_value = EVar2.m_value;
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1e0);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x29ea7ce);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    tcu::TestContext::setTestResult
              ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase
               .super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
  }
  return;
}

Assistant:

virtual void passAndLog (de::SharedPtr<ContextReset>& contextReset)
	{
		const glw::GLint status = contextReset->getSyncStatus();
		if (status != GL_SIGNALED)
		{
			m_testCtx.getLog()	<< tcu::TestLog::Message
								<< "Test failed! glGetSynciv() returned wrong value [" << glu::getErrorStr(status) << ", expected " << glu::getErrorStr(GL_SIGNALED) << "]"
								<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}